

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

int __thiscall Catch::Session::runInternal(Session *this)

{
  ReporterPreferences *pRVar1;
  bool *pbVar2;
  _Rb_tree_header *p_Var3;
  ColourMode CVar4;
  Config *pCVar5;
  undefined8 *puVar6;
  long lVar7;
  unique_ptr<Catch::MultiReporter> uVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar12;
  undefined4 extraout_var;
  undefined8 *puVar13;
  ostream *poVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t *psVar15;
  undefined4 extraout_var_02;
  TestCaseInfo **testInfo;
  _Rb_tree_color _Var16;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__x;
  pointer pPVar17;
  unique_ptr<Catch::MultiReporter> multi;
  IEventListenerPtr reporter;
  Totals totals;
  TestGroup tests;
  unique_ptr<Catch::MultiReporter> local_2c8;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [8];
  Totals local_2a8;
  Session *local_268;
  pointer local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  ColourMode local_248;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_240 [10];
  char local_38;
  
  if (this->m_startupExceptions != false) {
    return 1;
  }
  if ((this->m_configData).showHelp != false) {
    return 0;
  }
  if ((this->m_configData).libIdentify != false) {
    return 0;
  }
  if ((this->m_configData).shardCount <= (this->m_configData).shardIndex) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"The shard count (",0x11);
    poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,") must be greater than the shard index (",0x28);
    poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,")\n",2);
    std::ostream::flush();
    return 1;
  }
  config(this);
  pCVar5 = (this->m_config).m_ptr;
  sharedRng();
  uVar10 = (*(pCVar5->super_IConfig)._vptr_IConfig[0x11])(pCVar5);
  sharedRng::s_rng.m_state = (ulong)uVar10 * 0x5851f42d4c957f2d + 0x6f1903917447ed96;
  if ((this->m_configData).filenamesAsTags == true) {
    pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar11 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar12);
    puVar13 = (undefined8 *)
              (**(code **)(*(long *)CONCAT44(extraout_var,iVar11) + 0x10))
                        ((long *)CONCAT44(extraout_var,iVar11));
    puVar6 = (undefined8 *)puVar13[1];
    for (puVar13 = (undefined8 *)*puVar13; puVar13 != puVar6; puVar13 = puVar13 + 1) {
      TestCaseInfo::addFilenameTag((TestCaseInfo *)*puVar13);
    }
  }
  if (Context::currentContext == (long *)0x0) {
    Context::currentContext = (long *)operator_new(0x10);
    *Context::currentContext = 0;
    Context::currentContext[1] = 0;
  }
  pCVar5 = (this->m_config).m_ptr;
  *Context::currentContext = (long)pCVar5;
  pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
            ::getInternal();
  iVar11 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar12);
  if ((**(long **)CONCAT44(extraout_var_00,iVar11) ==
       (*(long **)CONCAT44(extraout_var_00,iVar11))[1]) &&
     (pPVar17 = (pCVar5->m_processedReporterSpecs).
                super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>
                ._M_impl.super__Vector_impl_data._M_start,
     (long)(pCVar5->m_processedReporterSpecs).
           super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar17 == 0x78)) {
    makeStream((Catch *)&local_2c8,(string *)&pPVar17->outputFilename);
    CVar4 = pPVar17->colourMode;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_2b0 + 8),&(pPVar17->customOptions)._M_t);
    p_Var3 = &local_240[0]._M_impl.super__Rb_tree_header;
    local_258._M_allocated_capacity = (size_type)local_2c8.m_ptr;
    local_2c8.m_ptr = (MultiReporter *)0x0;
    if ((_Base_ptr)local_2a8.assertions.failedButOk == (_Base_ptr)0x0) {
      psVar15 = &local_240[0]._M_impl.super__Rb_tree_header._M_node_count;
      local_240[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_240[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_240[0]._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
      local_240[0]._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
    }
    else {
      lVar7 = (long)&local_2a8.assertions.failed;
      local_240[0]._M_impl.super__Rb_tree_header._M_header._M_color =
           (_Rb_tree_color)local_2a8.assertions.failed;
      local_240[0]._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)local_2a8.assertions.failedButOk;
      local_240[0]._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)local_2a8.assertions.skipped;
      local_240[0]._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)local_2a8.testCases.passed;
      *(_Rb_tree_header **)(local_2a8.assertions.failedButOk + 8) = p_Var3;
      psVar15 = &local_2a8.testCases.failed;
      local_240[0]._M_impl.super__Rb_tree_header._M_node_count = local_2a8.testCases.failed;
      local_2a8.assertions.failedButOk = 0;
      local_2a8.assertions.skipped = lVar7;
      local_2a8.testCases.passed = lVar7;
    }
    local_258._8_8_ = pCVar5;
    local_248 = CVar4;
    *psVar15 = 0;
    anon_unknown_26::createReporter((string *)local_2c0,(ReporterConfig *)pPVar17);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(local_240);
    if ((MultiReporter *)local_258._M_allocated_capacity != (MultiReporter *)0x0) {
      (**(code **)(*(long *)local_258._M_allocated_capacity + 8))();
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_2b0 + 8));
  }
  else {
    local_2c8.m_ptr = (MultiReporter *)operator_new(0x40);
    ((local_2c8.m_ptr)->super_IEventListener).m_preferences.shouldRedirectStdOut = false;
    ((local_2c8.m_ptr)->super_IEventListener).m_preferences.shouldReportAllAssertions = false;
    ((local_2c8.m_ptr)->super_IEventListener).m_config = &pCVar5->super_IConfig;
    ((local_2c8.m_ptr)->super_IEventListener)._vptr_IEventListener =
         (_func_int **)&PTR__MultiReporter_001b12f0;
    (local_2c8.m_ptr)->m_insertedListeners = 0;
    ((local_2c8.m_ptr)->m_reporterLikes).
    super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_2c8.m_ptr)->m_reporterLikes).
    super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&((local_2c8.m_ptr)->m_reporterLikes).
             super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
    *(undefined8 *)
     ((long)&((local_2c8.m_ptr)->m_reporterLikes).
             super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
    pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar11 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar12);
    puVar13 = (undefined8 *)**(long **)CONCAT44(extraout_var_01,iVar11);
    puVar6 = (undefined8 *)(*(long **)CONCAT44(extraout_var_01,iVar11))[1];
    local_268 = this;
    if (puVar13 != puVar6) {
      do {
        uVar8.m_ptr = local_2c8.m_ptr;
        (**(code **)(*(long *)*puVar13 + 0x10))(&local_258,(long *)*puVar13,pCVar5);
        MultiReporter::addListener
                  (uVar8.m_ptr,(IEventListenerPtr *)&local_258._M_allocated_capacity);
        if ((MultiReporter *)local_258._M_allocated_capacity != (MultiReporter *)0x0) {
          (**(code **)(*(long *)local_258._M_allocated_capacity + 8))();
        }
        puVar13 = puVar13 + 1;
      } while (puVar13 != puVar6);
    }
    pPVar17 = (pCVar5->m_processedReporterSpecs).
              super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_260 = (pCVar5->m_processedReporterSpecs).
                super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (pPVar17 != local_260) {
      __x = &pPVar17->customOptions;
      do {
        uVar8.m_ptr = local_2c8.m_ptr;
        makeStream((Catch *)local_2b0,(string *)((long)(__x + -1) + 8));
        CVar4 = *(ColourMode *)((long)(__x + -1) + 0x28);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_2b0 + 8),&__x->_M_t);
        local_258._M_allocated_capacity = (size_type)local_2b0;
        local_2b0 = (undefined1  [8])0x0;
        if ((_Base_ptr)local_2a8.assertions.failedButOk == (_Base_ptr)0x0) {
          local_240[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_240[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_240[0]._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_240[0]._M_impl.super__Rb_tree_header._M_header;
          psVar15 = &local_240[0]._M_impl.super__Rb_tree_header._M_node_count;
          local_240[0]._M_impl.super__Rb_tree_header._M_header._M_right =
               local_240[0]._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        else {
          local_240[0]._M_impl.super__Rb_tree_header._M_header._M_color =
               (_Rb_tree_color)local_2a8.assertions.failed;
          local_240[0]._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)local_2a8.assertions.failedButOk;
          local_240[0]._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)local_2a8.assertions.skipped;
          local_240[0]._M_impl.super__Rb_tree_header._M_header._M_right =
               (_Base_ptr)local_2a8.testCases.passed;
          *(_Rb_tree_header **)(local_2a8.assertions.failedButOk + 8) =
               &local_240[0]._M_impl.super__Rb_tree_header;
          local_240[0]._M_impl.super__Rb_tree_header._M_node_count = local_2a8.testCases.failed;
          local_2a8.assertions.failedButOk = 0;
          local_2a8.assertions.skipped = (uint64_t)&local_2a8.assertions.failed;
          psVar15 = &local_2a8.testCases.failed;
          local_2a8.testCases.passed = local_2a8.assertions.skipped;
        }
        local_258._8_8_ = pCVar5;
        local_248 = CVar4;
        *psVar15 = 0;
        anon_unknown_26::createReporter
                  ((string *)(local_2c0 + 8),(ReporterConfig *)((long)(__x + -2) + 0x18));
        pRVar1 = &((uVar8.m_ptr)->super_IEventListener).m_preferences;
        pRVar1->shouldRedirectStdOut =
             (bool)(pRVar1->shouldRedirectStdOut | *(byte *)(local_2c0._8_8_ + 8));
        pbVar2 = &((uVar8.m_ptr)->super_IEventListener).m_preferences.shouldReportAllAssertions;
        *pbVar2 = (bool)(*pbVar2 | *(byte *)(local_2c0._8_8_ + 9));
        (uVar8.m_ptr)->m_haveNoncapturingReporters =
             (bool)((uVar8.m_ptr)->m_haveNoncapturingReporters | *(byte *)(local_2c0._8_8_ + 8) ^ 1)
        ;
        std::
        vector<Catch::Detail::unique_ptr<Catch::IEventListener>,std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>>>
        ::emplace_back<Catch::Detail::unique_ptr<Catch::IEventListener>>
                  ((vector<Catch::Detail::unique_ptr<Catch::IEventListener>,std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>>>
                    *)&(uVar8.m_ptr)->m_reporterLikes,
                   (unique_ptr<Catch::IEventListener> *)(local_2c0 + 8));
        if ((long *)local_2c0._8_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_2c0._8_8_ + 8))();
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(local_240);
        if ((MultiReporter *)local_258._M_allocated_capacity != (MultiReporter *)0x0) {
          (**(code **)(*(long *)local_258._M_allocated_capacity + 8))();
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(local_2b0 + 8));
        pPVar17 = (pointer)(__x + 1);
        __x = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)(__x + 2) + 0x18);
      } while (pPVar17 != local_260);
    }
    local_2c0._0_8_ = local_2c8.m_ptr;
    local_2c8.m_ptr = (MultiReporter *)0x0;
    Detail::unique_ptr<Catch::MultiReporter>::~unique_ptr(&local_2c8);
    this = local_268;
  }
  iVar11 = (*(((this->m_config).m_ptr)->super_IConfig)._vptr_IConfig[0xd])();
  puVar13 = *(undefined8 **)(CONCAT44(extraout_var_02,iVar11) + 0x18);
  puVar6 = *(undefined8 **)(CONCAT44(extraout_var_02,iVar11) + 0x20);
  if (puVar13 != puVar6) {
    do {
      (**(code **)(*(long *)local_2c0._0_8_ + 0x18))(local_2c0._0_8_,*puVar13,puVar13[1]);
      puVar13 = puVar13 + 4;
    } while (puVar13 != puVar6);
    _Var16 = _S_black;
    goto LAB_0013f4f1;
  }
  bVar9 = list((IEventListener *)local_2c0._0_8_,(this->m_config).m_ptr);
  _Var16 = _S_red;
  if (bVar9) goto LAB_0013f4f1;
  anon_unknown_26::TestGroup::TestGroup
            ((TestGroup *)&local_258,(IEventListenerPtr *)local_2c0,(this->m_config).m_ptr);
  anon_unknown_26::TestGroup::execute((Totals *)(local_2b0 + 8),(TestGroup *)&local_258);
  if (local_38 == '\x01') {
    iVar11 = (*(((this->m_config).m_ptr)->super_IConfig)._vptr_IConfig[7])();
    _Var16 = 3;
    if ((char)iVar11 == '\0') goto LAB_0013f47c;
  }
  else {
LAB_0013f47c:
    if ((long)&((_Rb_tree_node_base *)local_2a8.testCases.passed)->_M_color +
        local_2a8.testCases.failed + local_2a8.testCases.skipped + local_2a8.testCases.failedButOk
        == 0) {
      iVar11 = (*(((this->m_config).m_ptr)->super_IConfig)._vptr_IConfig[8])();
      _Var16 = 2;
      if ((char)iVar11 == '\0') goto LAB_0013f4e7;
    }
    if (((long)&((_Rb_tree_node_base *)local_2a8.testCases.passed)->_M_color +
         local_2a8.testCases.failed + local_2a8.testCases.failedButOk == 0) &&
       (local_2a8.testCases.skipped != 0)) {
      iVar11 = (*(((this->m_config).m_ptr)->super_IConfig)._vptr_IConfig[8])();
      _Var16 = 4;
      if ((char)iVar11 == '\0') goto LAB_0013f4e7;
    }
    _Var16 = 0xff;
    if ((int)(_Rb_tree_color)local_2a8.assertions.failed < 0xff) {
      _Var16 = (_Rb_tree_color)local_2a8.assertions.failed;
    }
  }
LAB_0013f4e7:
  anon_unknown_26::TestGroup::~TestGroup((TestGroup *)&local_258);
LAB_0013f4f1:
  if ((MultiReporter *)local_2c0._0_8_ != (MultiReporter *)0x0) {
    (**(code **)(*(long *)local_2c0._0_8_ + 8))();
  }
  return _Var16;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        if ( m_configData.shardIndex >= m_configData.shardCount ) {
            Catch::cerr() << "The shard count (" << m_configData.shardCount
                          << ") must be greater than the shard index ("
                          << m_configData.shardIndex << ")\n"
                          << std::flush;
            return 1;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if (m_configData.filenamesAsTags) {
                applyFilenamesAsTags();
            }

            // Set up global config instance before we start calling into other functions
            getCurrentMutableContext().setConfig(m_config.get());

            // Create reporter(s) so we can route listings through them
            auto reporter = prepareReporters(m_config.get());

            auto const& invalidSpecs = m_config->testSpec().getInvalidSpecs();
            if ( !invalidSpecs.empty() ) {
                for ( auto const& spec : invalidSpecs ) {
                    reporter->reportInvalidTestSpec( spec );
                }
                return 1;
            }


            // Handle list request
            if (list(*reporter, *m_config)) {
                return 0;
            }

            TestGroup tests { CATCH_MOVE(reporter), m_config.get() };
            auto const totals = tests.execute();

            if ( tests.hadUnmatchedTestSpecs()
                && m_config->warnAboutUnmatchedTestSpecs() ) {
                return 3;
            }

            if ( totals.testCases.total() == 0
                && !m_config->zeroTestsCountAsSuccess() ) {
                return 2;
            }

            if ( totals.testCases.total() > 0 &&
                 totals.testCases.total() == totals.testCases.skipped
                && !m_config->zeroTestsCountAsSuccess() ) {
                return 4;
            }

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, static_cast<int>(totals.assertions.failed));
        }